

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.h
# Opt level: O1

cmCommand * __thiscall cmDisallowedCommand::Clone(cmDisallowedCommand *this)

{
  PolicyID PVar1;
  pointer pcVar2;
  int iVar3;
  cmCommand *pcVar4;
  undefined4 extraout_var;
  
  pcVar4 = (cmCommand *)operator_new(0x48);
  iVar3 = (*this->Command->_vptr_cmCommand[6])();
  PVar1 = this->Policy;
  pcVar2 = this->Message;
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmDisallowedCommand_005ef308;
  pcVar4[1]._vptr_cmCommand = (_func_int **)CONCAT44(extraout_var,iVar3);
  *(PolicyID *)&pcVar4[1].Makefile = PVar1;
  pcVar4[1].Error._M_dataplus._M_p = pcVar2;
  return pcVar4;
}

Assistant:

cmCommand* Clone() override
  {
    return new cmDisallowedCommand(this->Command->Clone(), this->Policy,
                                   this->Message);
  }